

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexture1DProjGrad2(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float lod;
  anon_unknown_0 local_50 [16];
  tcu local_40 [16];
  undefined8 local_30;
  undefined8 uStack_28;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  lod = computeLodFromGrad1D(c);
  texture1D(local_50,c,fVar1 / fVar2,lod);
  tcu::operator*(local_40,(Vector<float,_4> *)local_50,&p->scale);
  tcu::operator+((tcu *)&local_30,(Vector<float,_4> *)local_40,&p->bias);
  *(undefined8 *)(c->color).m_data = local_30;
  *(undefined8 *)((c->color).m_data + 2) = uStack_28;
  return;
}

Assistant:

static void		evalTexture1DProjGrad2			(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1D(c, c.in[0].x()/c.in[0].y(), computeLodFromGrad1D(c))*p.scale + p.bias; }